

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miner.cpp
# Opt level: O0

void __thiscall xmrig::Miner::printHashrate(Miner *this,bool details)

{
  IBackend *pIVar1;
  bool bVar2;
  int iVar3;
  reference ppIVar4;
  undefined4 extraout_var;
  char *h;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  byte in_SIL;
  size_t in_RDI;
  double dVar8;
  Hashrate *hashrate;
  IBackend *backend;
  iterator __end1;
  iterator __begin1;
  vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_> *__range1;
  double speed [3];
  char num [32];
  vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_> *in_stack_ffffffffffffff58;
  __normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
  *in_stack_ffffffffffffff60;
  __normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
  local_68;
  long local_60;
  double local_58;
  double local_50;
  double local_48;
  undefined1 local_38 [47];
  byte local_9;
  Hashrate *this_00;
  
  local_9 = in_SIL & 1;
  memset(local_38,0,0x20);
  memset(&local_58,0,0x18);
  local_60 = *(long *)(in_RDI + 0x18) + 0x120;
  local_68._M_current =
       (IBackend **)
       std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>::begin
                 (in_stack_ffffffffffffff58);
  std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>::end(in_stack_ffffffffffffff58)
  ;
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff60,
                       (__normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
                        *)in_stack_ffffffffffffff58);
    if (!bVar2) break;
    ppIVar4 = __gnu_cxx::
              __normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
              ::operator*(&local_68);
    pIVar1 = *ppIVar4;
    iVar3 = (*pIVar1->_vptr_IBackend[4])();
    this_00 = (Hashrate *)CONCAT44(extraout_var,iVar3);
    if (this_00 != (Hashrate *)0x0) {
      dVar8 = Hashrate::calc(this_00,in_RDI);
      local_58 = dVar8 + local_58;
      dVar8 = Hashrate::calc(this_00,in_RDI);
      local_50 = dVar8 + local_50;
      dVar8 = Hashrate::calc(this_00,in_RDI);
      local_48 = dVar8 + local_48;
    }
    (*pIVar1->_vptr_IBackend[8])(pIVar1,(ulong)local_9 & 1);
    __gnu_cxx::
    __normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
    ::operator++(&local_68);
  }
  h = Hashrate::format((double)in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58,0x23020b)
  ;
  pcVar5 = Hashrate::format((double)h,(char *)in_stack_ffffffffffffff58,0x230229);
  pcVar6 = Hashrate::format((double)h,(char *)in_stack_ffffffffffffff58,0x230247);
  pcVar7 = Hashrate::format((double)h,(char *)in_stack_ffffffffffffff58,0x230273);
  Log::print(INFO,
             "\x1b[1;37mspeed\x1b[0m 10s/60s/15m \x1b[1;36m%s\x1b[0m\x1b[0;36m %s %s \x1b[0m\x1b[1;36mH/s\x1b[0m max \x1b[1;36m%s H/s\x1b[0m"
             ,h,pcVar5,pcVar6,pcVar7);
  return;
}

Assistant:

void xmrig::Miner::printHashrate(bool details)
{
    char num[8 * 4] = { 0 };
    double speed[3] = { 0.0 };

    for (IBackend *backend : d_ptr->backends) {
        const Hashrate *hashrate = backend->hashrate();
        if (hashrate) {
            speed[0] += hashrate->calc(Hashrate::ShortInterval);
            speed[1] += hashrate->calc(Hashrate::MediumInterval);
            speed[2] += hashrate->calc(Hashrate::LargeInterval);
        }

        backend->printHashrate(details);
    }

    LOG_INFO(WHITE_BOLD("speed") " 10s/60s/15m " CYAN_BOLD("%s") CYAN(" %s %s ") CYAN_BOLD("H/s") " max " CYAN_BOLD("%s H/s"),
             Hashrate::format(speed[0],                                 num,         sizeof(num) / 4),
             Hashrate::format(speed[1],                                 num + 8,     sizeof(num) / 4),
             Hashrate::format(speed[2],                                 num + 8 * 2, sizeof(num) / 4 ),
             Hashrate::format(d_ptr->maxHashrate,     num + 8 * 3, sizeof(num) / 4)
             );
}